

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::EntityDestinationRecord
          (EntityDestinationRecord *this,EntityIdentifier *ID,KUINT16 CommDeviceID,KUINT8 LineID,
          KUINT8 Priority,LineStateCommand LSC)

{
  KUINT16 KVar1;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityDestinationRecord_00232a40;
  (this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00220c98;
  KVar1 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_Entity).super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_Entity).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00220c00;
  *(undefined2 *)&(this->m_Entity).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  this->m_ui16DstCommsDvcID = CommDeviceID;
  this->m_ui8DstLineID = LineID;
  this->m_ui8DstPriority = Priority;
  this->m_ui8LnStCmd = (KUINT8)LSC;
  this->m_uiPadding1 = '\0';
  return;
}

Assistant:

EntityDestinationRecord::EntityDestinationRecord( const EntityIdentifier & ID, KUINT16 CommDeviceID, KUINT8 LineID,
        KUINT8 Priority, LineStateCommand LSC ) :
    m_Entity( ID ),
    m_ui16DstCommsDvcID( CommDeviceID ),
    m_ui8DstLineID( LineID ),
    m_ui8DstPriority( Priority ),
    m_ui8LnStCmd( LSC ),
    m_uiPadding1( 0 )
{
}